

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::ArenaTest_FuzzFuseFuseRace_Test::TestBody
          (ArenaTest_FuzzFuseFuseRace_Test *this)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ptVar2;
  pointer ptVar3;
  HiRep HVar4;
  uint32_t uVar5;
  ulong uVar6;
  allocator_type *paVar7;
  HiRep HVar8;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_625d3fb6_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_625d3fb6_for__M_head_impl *__args;
  thread *t;
  ulong uVar9;
  allocator_type *paVar10;
  allocator_type *paVar11;
  long lVar12;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int iVar13;
  bool bVar14;
  Time TVar15;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Notification done;
  RandenPoolSeedSeq seeder;
  BitGen gen;
  Environment env;
  vector<std::thread,_std::allocator<std::thread>_> local_7e8;
  HiRep local_7c8;
  size_type local_7c0;
  Notification local_7b8;
  Duration local_7a8;
  undefined1 local_798 [8];
  Environment *local_790;
  undefined1 auStack_788 [248];
  size_t local_690;
  Randen local_688;
  Environment local_678;
  
  local_7c8.lo_ = 0xfffffff8;
  local_7c8.hi_ = 0x7fffffff;
  memset(&local_678,0,0x648);
  local_7b8.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  local_7b8.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar13 = 0;
  __args = extraout_RDX;
  do {
    ptVar3 = local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar2 = local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_798 = (undefined1  [8])&local_7b8;
    local_790 = &local_678;
    if (local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar9 = (long)local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      uVar6 = uVar9 + (uVar9 == 0);
      local_7c0 = uVar6 + uVar9;
      if (0xffffffffffffffe < local_7c0) {
        local_7c0 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar6,uVar9)) {
        local_7c0 = 0xfffffffffffffff;
      }
      if (local_7c0 == 0) {
        paVar11 = (allocator_type *)0x0;
      }
      else {
        paVar11 = (allocator_type *)
                  __gnu_cxx::new_allocator<std::thread>::allocate
                            ((new_allocator<std::thread> *)&local_7e8,local_7c0,(void *)0x0);
        __args = extraout_RDX_01;
      }
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFuseRace_Test::TestBody()::__0>
                (paVar11 + uVar9 * 8,(thread *)local_798,__args);
      paVar10 = paVar11;
      for (paVar7 = (allocator_type *)ptVar2; paVar7 != (allocator_type *)ptVar3;
          paVar7 = paVar7 + 8) {
        *(id *)paVar10 = (id)0x0;
        *(native_handle_type *)paVar10 = (native_handle_type)*(id *)paVar7;
        *(id *)paVar7 = (id)0x0;
        paVar10 = paVar10 + 8;
      }
      __args = extraout_RDX_02;
      if ((allocator_type *)ptVar2 != (allocator_type *)0x0) {
        operator_delete(ptVar2,(long)local_7e8.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar2);
        __args = extraout_RDX_03;
      }
      local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(paVar11 + local_7c0 * 8);
      local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)paVar11;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFuseRace_Test::TestBody()::__0>
                ((allocator_type *)
                 local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)local_798,__args);
      __args = extraout_RDX_00;
      paVar10 = (allocator_type *)
                local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(paVar10 + 8);
    iVar13 = iVar13 + 1;
  } while (iVar13 != 10);
  absl::lts_20250127::random_internal::Randen::Randen(&local_688);
  local_690 = 0x20;
  uVar6 = (ulong)((uint)(randen_engine<unsigned_long> *)local_798 & 8);
  *(undefined8 *)(local_798 + uVar6) = 0;
  *(undefined8 *)(auStack_788 + (uVar6 - 8)) = 0;
  memset(auStack_788 + uVar6,0,0xf0);
  absl::lts_20250127::random_internal::randen_engine<unsigned_long>::
  reseed<absl::lts_20250127::random_internal::RandenPoolSeedSeq>
            ((randen_engine<unsigned_long> *)local_798,(RandenPoolSeedSeq *)&local_7a8);
  local_7a8 = (Duration)absl::lts_20250127::Now();
  absl::lts_20250127::Duration::operator+=(&local_7a8,(Duration)ZEXT812(2));
  HVar4 = local_7a8.rep_hi_;
  uVar5 = local_7a8.rep_lo_;
  uVar1 = local_7a8.rep_lo_ + 1;
  local_7c8 = (HiRep)((long)local_7c8 + 8);
  while( true ) {
    TVar15 = absl::lts_20250127::Now();
    HVar8 = TVar15.rep_.rep_hi_;
    if (HVar8 == HVar4) {
      if (HVar8 == local_7c8) {
        bVar14 = TVar15.rep_.rep_lo_ + 1 < uVar1;
      }
      else {
        bVar14 = TVar15.rep_.rep_lo_ < uVar5;
      }
    }
    else {
      bVar14 = (long)HVar8 < (long)HVar4;
    }
    if (!bVar14) break;
    Environment::RandomFuse(&local_678,(BitGen *)local_798);
  }
  absl::lts_20250127::Notification::Notify(&local_7b8);
  ptVar2 = local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar11 = (allocator_type *)
                 local_7e8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start; paVar11 != (allocator_type *)ptVar2;
      paVar11 = paVar11 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_7e8);
  absl::lts_20250127::Notification::~Notification(&local_7b8);
  absl::lts_20250127::Mutex::Dtor(&local_678.mutex_);
  lVar12 = 0x640;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)local_678.arenas_._M_elems + lVar12 + -8);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  return;
}

Assistant:

TEST(ArenaTest, FuzzFuseFuseRace) {
  Environment env;

  absl::Notification done;
  std::vector<std::thread> threads;
  for (int i = 0; i < 10; ++i) {
    threads.emplace_back([&]() {
      absl::BitGen gen;
      while (!done.HasBeenNotified()) {
        env.RandomFuse(gen);
      }
    });
  }

  absl::BitGen gen;
  auto end = absl::Now() + absl::Seconds(2);
  while (absl::Now() < end) {
    env.RandomFuse(gen);
  }
  done.Notify();
  for (auto& t : threads) t.join();
}